

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transfer_Control_Request_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Transfer_Control_Request_PDU::Decode
          (Transfer_Control_Request_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  int iVar2;
  undefined7 in_register_00000011;
  uint uVar3;
  allocator<char> local_59;
  RecordSet local_58;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar2 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar2 = 0;
  }
  if (0x27 < iVar2 + (uint)KVar1) {
    std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::clear
              (&this->m_vRecs);
    Simulation_Management_Header::Decode
              (&this->super_Simulation_Management_Header,stream,ignoreHeader);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32ReqID);
    KDataStream::Read(stream,&this->m_ui8ReqRelSrv);
    KDataStream::Read(stream,&this->m_ui8TrnTyp);
    (*(this->m_TrnsEntID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_TrnsEntID,stream);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32NumRecSets);
    for (uVar3 = 0; uVar3 < this->m_ui32NumRecSets; uVar3 = uVar3 + 1) {
      DATA_TYPE::RecordSet::RecordSet(&local_58,stream);
      std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::
      emplace_back<KDIS::DATA_TYPE::RecordSet>(&this->m_vRecs,&local_58);
      DATA_TYPE::RecordSet::~RecordSet(&local_58);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Decode",&local_59);
  KException::KException(this_00,(KString *)&local_58,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Transfer_Control_Request_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < TRANSFER_CONTROL_REQUEST_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vRecs.clear();

    Simulation_Management_Header::Decode( stream, ignoreHeader );

    stream >> m_ui32ReqID
           >> m_ui8ReqRelSrv
           >> m_ui8TrnTyp
           >> KDIS_STREAM m_TrnsEntID
           >> m_ui32NumRecSets;

    for( KUINT32 i = 0; i < m_ui32NumRecSets; ++i )
    {
        m_vRecs.push_back( RecordSet( stream ) );
    }
}